

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall MipsParser::parseParameters(MipsParser *this,Parser *parser,tMipsOpcode *opcode)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  Token *pTVar8;
  long lVar9;
  undefined8 uVar10;
  byte *pbVar11;
  TokenType type;
  MipsParser *this_00;
  byte *pbVar12;
  MipsRegisterValue tempRegister;
  byte *local_130;
  int local_124;
  MipsRegisterValue *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  int *local_108;
  MipsRegisterValue *local_100;
  _Alloc_hider local_f8;
  Expression *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  MipsRegisterValue *local_d8;
  MipsRegisterValue *local_d0;
  _Alloc_hider local_c8;
  MipsRegisterValue *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  int *local_a8;
  MipsRegisterValue *local_a0;
  _Alloc_hider local_98;
  MipsRegisterValue *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int *local_78;
  MipsRegisterValue *local_70;
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  int local_38;
  
  pbVar11 = (byte *)opcode->encoding;
  (this->immediate).primary.type = None;
  if (this->hasFixedSecondaryImmediate == false) {
    (this->immediate).secondary.type = None;
  }
  local_124 = (this->opcodeData).vfpuSize;
  if (local_124 == -1) {
    uVar2 = opcode->flags;
    iVar7 = 0;
    if ((((uVar2 >> 0x13 & 1) == 0) && (iVar7 = 1, (uVar2 >> 0x16 & 1) == 0)) &&
       (iVar7 = 2, (uVar2 >> 0x17 & 1) == 0)) {
      iVar7 = 3;
      local_124 = -1;
      if ((uVar2 >> 0x14 & 1) == 0) goto LAB_00168ccb;
    }
    (this->opcodeData).vfpuSize = iVar7;
    local_124 = iVar7;
  }
LAB_00168ccb:
  local_60._8_8_ = &local_48;
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_60._16_8_ = 0;
  bVar5 = *pbVar11;
  local_118._M_allocated_capacity = (size_type)opcode;
  if (bVar5 == 0) {
LAB_0016959a:
    pcVar3 = *(char **)local_118._M_allocated_capacity;
    pcVar4 = *(char **)(local_118._M_allocated_capacity + 8);
    uVar10 = *(undefined8 *)(local_118._M_allocated_capacity + 0x18);
    *(undefined8 *)&(this->opcodeData).opcode.destencoding =
         *(undefined8 *)(local_118._M_allocated_capacity + 0x10);
    *(undefined8 *)&(this->opcodeData).opcode.flags = uVar10;
    (this->opcodeData).opcode.name = pcVar3;
    (this->opcodeData).opcode.encoding = pcVar4;
    setOmittedRegisters(this,(tMipsOpcode *)local_118._M_allocated_capacity);
    pTVar8 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar6 = pTVar8->type == Separator;
switchD_00168e4d_caseD_55:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._8_8_ != &local_48) {
      operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
    }
    return bVar6;
  }
  local_88._M_allocated_capacity = (size_type)&this->immediate;
  local_108 = &(this->immediate).primary.originalValue;
  local_78 = &(this->opcodeData).vectorCondition;
  local_a8 = &(this->immediate).secondary.originalValue;
  local_f0 = &(this->immediate).secondary.expression;
  local_68._M_p = (pointer)&(this->immediate).primary.expression;
  local_b8._8_8_ = &(this->registers).rspvealt;
  local_b8._M_allocated_capacity = (size_type)&(this->registers).rspvde;
  local_e8._M_allocated_capacity = (size_type)&(this->registers).rspve;
  local_c0 = &(this->registers).rspvrs;
  local_c8._M_p = (pointer)&(this->registers).rspvrd;
  local_d0 = &(this->registers).rspvrt;
  local_120 = &(this->registers).grd;
  local_e8._8_8_ = &(this->registers).grt;
  local_90 = &(this->registers).ps2vrs;
  local_98._M_p = (pointer)&(this->registers).ps2vrd;
  local_a0 = &(this->registers).ps2vrt;
  local_118._8_8_ = &(this->registers).vrd;
  local_f8._M_p = (pointer)&(this->registers).vrt;
  local_100 = &(this->registers).vrs;
  local_d8 = &(this->registers).frs;
  local_88._8_8_ = &(this->registers).frd;
  local_70 = &(this->registers).frt;
  this_00 = this;
LAB_00168e2a:
  pbVar12 = pbVar11 + 1;
  bVar6 = false;
  local_130 = pbVar12;
  if (bVar5 < 0x43) {
    if (bVar5 == 0x28) {
      type = LParen;
    }
    else if (bVar5 == 0x29) {
      type = RParen;
    }
    else {
      if (bVar5 != 0x2c) goto switchD_00168e4d_caseD_55;
      type = Comma;
    }
    this_00 = (MipsParser *)parser;
    bVar6 = Parser::matchToken(parser,type,false);
    goto joined_r0x00169355;
  }
  bVar6 = false;
  switch(bVar5) {
  case 0x52:
    pbVar12 = pbVar11 + 2;
    bVar6 = false;
    local_130 = pbVar12;
    switch(pbVar11[1]) {
    case 99:
      bVar6 = parseRspVectorControlRegister(this_00,parser,local_120);
      break;
    case 100:
      local_c8._M_p[0] = '\n';
      local_c8._M_p[1] = '\0';
      local_c8._M_p[2] = '\0';
      local_c8._M_p[3] = '\0';
      bVar6 = parseRegisterTable(this_00,parser,(MipsRegisterValue *)local_c8._M_p,
                                 mipsRspVectorRegisters,0x2a);
      break;
    case 0x65:
      bVar6 = parseRspVectorElement
                        (this_00,parser,(MipsRegisterValue *)local_e8._M_allocated_capacity);
      break;
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
      goto switchD_00168e4d_caseD_55;
    case 0x6c:
      bVar6 = parseRspScalarElement
                        (this_00,parser,(MipsRegisterValue *)local_e8._M_allocated_capacity);
      break;
    case 0x6d:
      bVar6 = parseRspScalarElement
                        (this_00,parser,(MipsRegisterValue *)local_b8._M_allocated_capacity);
      break;
    case 0x6f:
      bVar6 = parseRspOffsetElement(this_00,parser,(MipsRegisterValue *)local_b8._8_8_);
      break;
    case 0x73:
      local_c0->type = RspVector;
      bVar6 = parseRegisterTable(this_00,parser,local_c0,mipsRspVectorRegisters,0x2a);
      break;
    case 0x74:
      local_d0->type = RspVector;
      bVar6 = parseRegisterTable(this_00,parser,local_d0,mipsRspVectorRegisters,0x2a);
      break;
    default:
      if (pbVar11[1] != 0x7a) goto switchD_00168e4d_caseD_55;
      bVar6 = parseRspCop0Register(this_00,parser,local_120);
    }
    break;
  case 0x53:
    bVar6 = parseFpuRegister(this_00,parser,local_d8);
    break;
  case 0x54:
    bVar6 = parseFpuRegister(this_00,parser,local_70);
    break;
  case 0x55:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x65:
  case 0x68:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x78:
  case 0x79:
    goto switchD_00168e4d_caseD_55;
  case 0x56:
    pbVar12 = pbVar11 + 2;
    bVar5 = pbVar11[1];
    local_130 = pbVar12;
    if (bVar5 == 100) {
      local_98._M_p[0] = '\x04';
      local_98._M_p[1] = '\0';
      local_98._M_p[2] = '\0';
      local_98._M_p[3] = '\0';
      bVar6 = parseRegisterTable(this_00,parser,(MipsRegisterValue *)local_98._M_p,
                                 mipsPs2Cop2FpRegisters,0x2a);
    }
    else if (bVar5 == 0x73) {
      local_90->type = Ps2Cop2;
      bVar6 = parseRegisterTable(this_00,parser,local_90,mipsPs2Cop2FpRegisters,0x2a);
    }
    else {
      if (bVar5 != 0x74) goto LAB_001695d3;
      local_a0->type = Ps2Cop2;
      bVar6 = parseRegisterTable(this_00,parser,local_a0,mipsPs2Cop2FpRegisters,0x2a);
    }
    break;
  case 0x57:
    local_130 = pbVar11 + 2;
    bVar5 = pbVar11[1];
    bVar6 = false;
    pbVar11 = local_130;
    if (bVar5 < 0x72) {
      if (bVar5 == 99) {
        bVar6 = parseVcstParameter(this_00,parser,local_108);
LAB_001693d3:
        if (bVar6 == false) goto LAB_001695d3;
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate5;
        goto LAB_00168ee6;
      }
      if (bVar5 != 100) goto switchD_00168e4d_caseD_55;
      bVar6 = parseVpfxdParameter(this_00,parser,local_108);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).primary.value = (this->immediate).primary.originalValue;
      (this->immediate).primary.type = Immediate16;
    }
    else {
      if (bVar5 == 0x72) {
        bVar6 = parseVfpuVrot(this_00,parser,local_108,(this->opcodeData).vfpuSize);
        goto LAB_001693d3;
      }
      if (bVar5 != 0x73) goto switchD_00168e4d_caseD_55;
      bVar6 = parseVpfxsParameter(this_00,parser,local_108);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).primary.value = (this->immediate).primary.originalValue;
      (this->immediate).primary.type = Immediate20_0;
    }
    goto LAB_00168ee6;
  case 100:
    bVar6 = parseRegister(this_00,parser,local_120);
    break;
  case 0x66:
    bVar6 = parseFpuControlRegister(this_00,parser,local_d8);
    break;
  case 0x67:
    pbVar12 = pbVar11 + 2;
    bVar5 = pbVar11[1];
    local_130 = pbVar12;
    if (bVar5 == 99) {
      bVar6 = parsePsxCop2ControlRegister(this_00,parser,local_120);
    }
    else if (bVar5 == 0x73) {
      bVar6 = parsePsxCop2DataRegister(this_00,parser,local_120);
    }
    else {
      if (bVar5 != 0x74) goto LAB_001695d3;
      bVar6 = parsePsxCop2DataRegister(this_00,parser,(MipsRegisterValue *)local_e8._8_8_);
    }
    break;
  case 0x69:
    bVar6 = parseImmediate(this_00,parser,(Expression *)local_68._M_p);
    if (bVar6) {
      this_00 = (MipsParser *)&local_130;
      bVar6 = decodeImmediateSize((char **)this_00,
                                  (MipsImmediateType *)local_88._M_allocated_capacity);
      pbVar11 = local_130;
      if (bVar6) goto LAB_00168ee6;
    }
    goto LAB_001695d3;
  case 0x6a:
    pbVar12 = pbVar11 + 2;
    bVar6 = false;
    local_130 = pbVar12;
    switch(pbVar11[1]) {
    case 0x62:
      bVar6 = parseCop2BranchCondition(this_00,parser,local_a8);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).secondary.type = Cop2BranchType;
      (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
      pbVar11 = pbVar12;
      break;
    case 99:
      bVar6 = parseImmediate(this_00,parser,local_f0);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).secondary.type = CacheOp;
      pbVar11 = pbVar12;
      break;
    default:
      goto switchD_00168e4d_caseD_55;
    case 0x65:
      bVar6 = parseImmediate(this_00,parser,local_f0);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).secondary.type = Ext;
      pbVar11 = pbVar12;
      break;
    case 0x69:
      bVar6 = parseImmediate(this_00,parser,local_f0);
      if (!bVar6) goto LAB_001695d3;
      (this->immediate).secondary.type = Ins;
      pbVar11 = pbVar12;
    }
    goto LAB_00168ee6;
  case 0x6d:
    pbVar12 = pbVar11 + 2;
    bVar5 = pbVar11[1];
    local_130 = pbVar12;
    if (bVar5 == 100) {
      bVar6 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_118._8_8_,
                                (this->opcodeData).vfpuSize);
      uVar10 = local_118._8_8_;
    }
    else {
      if (bVar5 != 0x74) {
        if ((bVar5 != 0x73) ||
           (bVar6 = parseVfpuRegister(this_00,parser,local_100,(this->opcodeData).vfpuSize),
           !bVar6 || local_100->type != VfpuMatrix)) goto LAB_001695d3;
        pbVar11 = pbVar12;
        if ((*(byte *)(local_118._M_allocated_capacity + 0x1a) & 0x20) != 0) {
          piVar1 = &(this->registers).vrs.num;
          *(byte *)piVar1 = (byte)*piVar1 ^ 0x20;
        }
        goto LAB_00168ee6;
      }
      bVar6 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_f8._M_p,
                                (this->opcodeData).vfpuSize);
      uVar10 = local_f8._M_p;
    }
    bVar6 = (bool)(bVar6 & ((MipsRegisterValue *)uVar10)->type == VfpuMatrix);
    break;
  case 0x72:
    bVar6 = parseRegister(this_00,parser,(MipsRegisterValue *)local_60);
    if ((bVar6) &&
       (local_130 = pbVar11 + 2, pbVar12 = pbVar11 + 1, pbVar11 = local_130,
       local_38 == (char)*pbVar12)) goto LAB_00168ee6;
    goto LAB_001695d3;
  case 0x73:
    bVar6 = parseRegister(this_00,parser,(MipsRegisterValue *)this);
    break;
  case 0x74:
    bVar6 = parseRegister(this_00,parser,(MipsRegisterValue *)local_e8._8_8_);
    break;
  case 0x76:
    bVar5 = *pbVar12;
    lVar9 = 1;
    if (bVar5 == 0x53) {
      bVar5 = pbVar11[2];
      local_124 = 0;
      lVar9 = 2;
    }
    pbVar12 = pbVar11 + lVar9 + 1;
    bVar6 = false;
    pbVar11 = pbVar12;
    local_130 = pbVar12;
    if (bVar5 < 0x73) {
      if (bVar5 == 99) {
        bVar6 = parseVfpuControlRegister(this_00,parser,(MipsRegisterValue *)local_118._8_8_);
        break;
      }
      if (bVar5 == 100) {
        bVar6 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_118._8_8_,local_124);
        if (!bVar6 || *(int *)local_118._8_8_ != 7) goto LAB_001695d3;
        if ((*(byte *)(local_118._M_allocated_capacity + 0x1a) & 4) != 0) {
          bVar5 = (byte)(this->registers).vrd.num;
          goto joined_r0x00169448;
        }
        goto LAB_00168ee6;
      }
      goto switchD_00168e4d_caseD_55;
    }
    if (bVar5 != 0x74) {
      if (bVar5 == 0x73) {
        bVar6 = parseVfpuRegister(this_00,parser,local_100,local_124);
        if (bVar6 && local_100->type == VfpuVector) {
          if ((*(byte *)(local_118._M_allocated_capacity + 0x1a) & 4) != 0) {
            bVar5 = (byte)(this->registers).vrs.num;
joined_r0x00169448:
            if ((bVar5 & 0x40) != 0) goto LAB_001695d3;
          }
          goto LAB_00168ee6;
        }
        goto LAB_001695d3;
      }
      goto switchD_00168e4d_caseD_55;
    }
    bVar6 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_f8._M_p,local_124);
    if (bVar6 && *(int *)local_f8._M_p == 7) {
      if ((*(byte *)(local_118._M_allocated_capacity + 0x1a) & 4) != 0) {
        bVar5 = (byte)(this->registers).vrt.num;
        goto joined_r0x00169448;
      }
      goto LAB_00168ee6;
    }
    goto LAB_001695d3;
  case 0x77:
    bVar6 = parseWb(this_00,parser);
    break;
  case 0x7a:
    bVar6 = parseCop0Register(this_00,parser,local_120);
    break;
  default:
    if (bVar5 == 0x43) {
      bVar6 = parseVfpuCondition(this_00,parser,local_78);
    }
    else {
      if (bVar5 != 0x44) goto switchD_00168e4d_caseD_55;
      bVar6 = parseFpuRegister(this_00,parser,(MipsRegisterValue *)local_88._8_8_);
    }
  }
joined_r0x00169355:
  pbVar11 = pbVar12;
  if (bVar6 == false) {
LAB_001695d3:
    bVar6 = false;
    goto switchD_00168e4d_caseD_55;
  }
LAB_00168ee6:
  bVar5 = *pbVar11;
  if (bVar5 == 0) goto LAB_0016959a;
  goto LAB_00168e2a;
}

Assistant:

bool MipsParser::parseParameters(Parser& parser, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = MipsImmediateType::None;
	if (!hasFixedSecondaryImmediate)
		immediate.secondary.type = MipsImmediateType::None;

	if (opcodeData.vfpuSize == -1)
	{
		if (opcode.flags & MO_VFPU_SINGLE)
			opcodeData.vfpuSize = 0;
		else if (opcode.flags & MO_VFPU_PAIR)
			opcodeData.vfpuSize = 1;
		else if (opcode.flags & MO_VFPU_TRIPLE)
			opcodeData.vfpuSize = 2;
		else if (opcode.flags & MO_VFPU_QUAD)
			opcodeData.vfpuSize = 3;
	}

	// parse parameters
	MipsRegisterValue tempRegister;
	int actualSize = opcodeData.vfpuSize;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'T':	// float register
			CHECK(parseFpuRegister(parser,registers.frt));
			break;
		case 'D':	// float register
			CHECK(parseFpuRegister(parser,registers.frd));
			break;
		case 'S':	// float register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'f':	// fpu control register
			CHECK(parseFpuControlRegister(parser,registers.frs));
			break;
		case 'z':	// cop0 register
			CHECK(parseCop0Register(parser,registers.grd));
			break;
		case 'v':	// psp vfpu reg
			if (*encoding == 'S')
			{
				encoding++;
				actualSize = 0;
			}

			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,actualSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrs.num & 0x40));
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,actualSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrt.num & 0x40));
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,actualSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrd.num & 0x40));
				break;
			case 'c':
				CHECK(parseVfpuControlRegister(parser,registers.vrd));
				break;
			default:
				return false;
			}
			break;
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,opcodeData.vfpuSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuMatrix);
				if (opcode.flags & MO_VFPU_TRANSPOSE_VS)
					registers.vrs.num ^= 0x20;
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,opcodeData.vfpuSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuMatrix);
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,opcodeData.vfpuSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuMatrix);
				break;
			default:
				return false;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 't':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrt));
				break;
			case 'd':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrd));
				break;
			case 's':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrs));
				break;
			default:
				return false;
			}
			break;
		case 'g':	// psx cop2 reg
			switch (*encoding++)
			{
			case 't':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grt));
				break;
			case 's':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grd));
				break;
			case 'c':	// gte control register
				CHECK(parsePsxCop2ControlRegister(parser,registers.grd));
				break;
			default:
				return false;
			}
			break;
		case 'r':	// forced register
			CHECK(parseRegister(parser,tempRegister));
			CHECK(tempRegister.num == *encoding++);
			break;
		case 'R':	// rsp register
			switch (*encoding++)
			{
			case 'z':	// cop0 register
				CHECK(parseRspCop0Register(parser,registers.grd));
				break;
			case 'c':	// vector control register
				CHECK(parseRspVectorControlRegister(parser,registers.grd));
				break;
			case 't':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrt));
				break;
			case 'd':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrd));
				break;
			case 's':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrs));
				break;
			case 'e':	// vector element
				CHECK(parseRspVectorElement(parser,registers.rspve));
				break;
			case 'l':	// scalar element
				CHECK(parseRspScalarElement(parser,registers.rspve));
				break;
			case 'm':	// scalar destination element
				CHECK(parseRspScalarElement(parser,registers.rspvde));
				break;
			case 'o':	// byte offset element
				CHECK(parseRspOffsetElement(parser,registers.rspvealt));
				break;
			default:
				return false;
			}
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case 'j':	// secondary immediate
			switch (*encoding++)
			{
			case 'c':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::CacheOp;
				break;
			case 'e':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ext;
				break;
			case 'i':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ins;
				break;
			case 'b':
				CHECK(parseCop2BranchCondition(parser,immediate.secondary.originalValue));
				immediate.secondary.type = MipsImmediateType::Cop2BranchType;
				immediate.secondary.value = immediate.secondary.originalValue;
				break;
			default:
				return false;
			}
			break;
		case 'C':	// vfpu condition
			CHECK(parseVfpuCondition(parser,opcodeData.vectorCondition));
			break;
		case 'W':	// vfpu argument
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVpfxsParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate20_0;
				break;
			case 'd':
				CHECK(parseVpfxdParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate16;
				break;
			case 'c':
				CHECK(parseVcstParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			case 'r':
				CHECK(parseVfpuVrot(parser,immediate.primary.originalValue,opcodeData.vfpuSize));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			default:
				return false;
			}
			break;
		case 'w':	// 'wb' characters
			CHECK(parseWb(parser));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;
	setOmittedRegisters(opcode);

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}